

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O0

void pmp_update_rule(CPURISCVState_conflict2 *env,uint32_t pmp_index)

{
  uint8_t uVar1;
  target_ulong tStack_40;
  uint8_t a_field;
  target_ulong ea;
  target_ulong sa;
  target_ulong prev_addr;
  target_ulong this_addr;
  int local_18;
  uint32_t uStack_14;
  uint8_t this_cfg;
  int i;
  uint32_t pmp_index_local;
  CPURISCVState_conflict2 *env_local;
  
  (env->pmp_state).num_rules = 0;
  this_addr._7_1_ = (env->pmp_state).pmp[pmp_index].cfg_reg;
  prev_addr = (env->pmp_state).pmp[pmp_index].addr_reg;
  sa = 0;
  ea = 0;
  tStack_40 = 0;
  if (pmp_index != 0) {
    sa = (env->pmp_state).pmp[pmp_index - 1].addr_reg;
  }
  uStack_14 = pmp_index;
  _i = env;
  uVar1 = pmp_get_a_field(this_addr._7_1_);
  switch(uVar1) {
  case '\0':
    ea = 0;
    tStack_40 = 0xffffffffffffffff;
    break;
  case '\x01':
    ea = sa << 2;
    tStack_40 = prev_addr * 4 - 1;
    break;
  case '\x02':
    ea = prev_addr << 2;
    tStack_40 = prev_addr + 3;
    break;
  case '\x03':
    pmp_decode_napot(prev_addr,&ea,&stack0xffffffffffffffc0);
    break;
  default:
    ea = 0;
    tStack_40 = 0;
  }
  (_i->pmp_state).addr[uStack_14].sa = ea;
  (_i->pmp_state).addr[uStack_14].ea = tStack_40;
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    uVar1 = pmp_get_a_field((_i->pmp_state).pmp[local_18].cfg_reg);
    if (uVar1 != '\0') {
      (_i->pmp_state).num_rules = (_i->pmp_state).num_rules + 1;
    }
  }
  return;
}

Assistant:

static void pmp_update_rule(CPURISCVState *env, uint32_t pmp_index)
{
    int i;

    env->pmp_state.num_rules = 0;

    uint8_t this_cfg = env->pmp_state.pmp[pmp_index].cfg_reg;
    target_ulong this_addr = env->pmp_state.pmp[pmp_index].addr_reg;
    target_ulong prev_addr = 0u;
    target_ulong sa = 0u;
    target_ulong ea = 0u;

    if (pmp_index >= 1u) {
        prev_addr = env->pmp_state.pmp[pmp_index - 1].addr_reg;
    }

    switch (pmp_get_a_field(this_cfg)) {
    case PMP_AMATCH_OFF:
        sa = 0u;
        ea = -1;
        break;

    case PMP_AMATCH_TOR:
        sa = prev_addr << 2; /* shift up from [xx:0] to [xx+2:2] */
        ea = (this_addr << 2) - 1u;
        break;

    case PMP_AMATCH_NA4:
        sa = this_addr << 2; /* shift up from [xx:0] to [xx+2:2] */
        ea = (this_addr + 4u) - 1u;
        break;

    case PMP_AMATCH_NAPOT:
        pmp_decode_napot(this_addr, &sa, &ea);
        break;

    default:
        sa = 0u;
        ea = 0u;
        break;
    }

    env->pmp_state.addr[pmp_index].sa = sa;
    env->pmp_state.addr[pmp_index].ea = ea;

    for (i = 0; i < MAX_RISCV_PMPS; i++) {
        const uint8_t a_field =
            pmp_get_a_field(env->pmp_state.pmp[i].cfg_reg);
        if (PMP_AMATCH_OFF != a_field) {
            env->pmp_state.num_rules++;
        }
    }
}